

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_operators.cpp
# Opt level: O2

Matrix<long_double> *
neural_networks::utilities::matrix_operators::multiply
          (Matrix<long_double> *first,NeuralMatrix *other)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  Matrix<long_double> *this;
  length_error *this_00;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  longdouble lVar10;
  
  if (first->M == (other->super_Matrix<neural_networks::utilities::Neuron_*>).N) {
    this = (Matrix<long_double> *)operator_new(0x30);
    Matrix<long_double>::Matrix
              (this,first->N,(other->super_Matrix<neural_networks::utilities::Neuron_*>).M);
    sVar1 = first->N;
    for (sVar4 = 0; sVar4 != sVar1; sVar4 = sVar4 + 1) {
      sVar2 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
      for (sVar5 = 0; sVar5 != sVar2; sVar5 = sVar5 + 1) {
        lVar3 = *(long *)&(this->matrix).
                          super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar4].
                          super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                          super__Vector_impl_data;
        *(longdouble *)(lVar3 + sVar5 * 0x10) = (longdouble)0;
        sVar6 = first->M;
        lVar7 = 0;
        lVar8 = 0;
        lVar10 = (longdouble)0;
        while (bVar9 = sVar6 != 0, sVar6 = sVar6 - 1, bVar9) {
          lVar10 = *(longdouble *)
                    (*(long *)(*(long *)((long)&(((other->
                                                  super_Matrix<neural_networks::utilities::Neuron_*>
                                                  ).matrix.
                                                  super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                                                )._M_impl.super__Vector_impl_data + lVar8) +
                              sVar5 * 8) + 0x20) *
                   *(longdouble *)
                    (*(long *)&(first->matrix).
                               super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[sVar4].
                               super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl
                               .super__Vector_impl_data + lVar7) + lVar10;
          *(longdouble *)(lVar3 + sVar5 * 0x10) = lVar10;
          lVar8 = lVar8 + 0x18;
          lVar7 = lVar7 + 0x10;
        }
      }
    }
    return this;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"Dimension mismatch");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

Matrix<long double>* matrix_operators::multiply(const Matrix<long double> *first, const NeuralMatrix *other)  {
    if(first -> M == other -> N) {
        Matrix<long double> *product = new Matrix<long double>(first -> N, other -> M);
        if(product == nullptr) {
            return nullptr;
        }
        register size_t i, j, k;
        for(i = 0; i < first -> N; ++i) {
            for(j = 0; j < other -> M; ++j) {
                product -> matrix[i][j] = 0;
                for(k = 0; k < first -> M; ++k) {
                    product -> matrix[i][j] += first -> matrix[i][k] * other -> matrix[k][j] -> function;
                }
            }
        }
        return product;
    } else {
        throw std::length_error("Dimension mismatch");
    }
}